

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildMethod
          (DescriptorBuilder *this,MethodDescriptorProto *proto,ServiceDescriptor *parent,
          MethodDescriptor *result)

{
  bool bVar1;
  DescriptorPool *pDVar2;
  Tables *orig_options;
  DescriptorBuilder *in_RCX;
  ServiceDescriptor *in_RDX;
  Message *in_stack_00000008;
  string *in_stack_00000010;
  string *in_stack_00000018;
  DescriptorBuilder *in_stack_00000020;
  string *in_stack_00000040;
  string *in_stack_00000048;
  string *full_name;
  Message *in_stack_00000208;
  string *in_stack_00000210;
  void *in_stack_00000218;
  string *in_stack_00000220;
  DescriptorBuilder *in_stack_00000228;
  Symbol in_stack_00000240;
  string *in_stack_ffffffffffffffa8;
  Tables *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffcc;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_ffffffffffffffd0;
  
  MethodDescriptorProto::name_abi_cxx11_((MethodDescriptorProto *)0x4cd115);
  pDVar2 = (DescriptorPool *)
           DescriptorPool::Tables::AllocateString
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RCX->pool_ = pDVar2;
  in_RCX->error_collector_ = (ErrorCollector *)in_RDX;
  ServiceDescriptor::full_name_abi_cxx11_(in_RDX);
  orig_options = (Tables *)
                 AllocateNameString((DescriptorBuilder *)full_name,in_stack_00000048,
                                    in_stack_00000040);
  in_RCX->tables_ = orig_options;
  MethodDescriptorProto::name_abi_cxx11_((MethodDescriptorProto *)0x4cd177);
  ValidateSymbolName(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  internal::LazyDescriptor::Init((LazyDescriptor *)&in_RCX->options_to_interpret_);
  internal::LazyDescriptor::Init((LazyDescriptor *)&in_RCX->filename_);
  bVar1 = MethodDescriptorProto::has_options((MethodDescriptorProto *)0x4cd1b4);
  if (bVar1) {
    MethodDescriptorProto::options((MethodDescriptorProto *)0x4cd1d1);
    AllocateOptions<google::protobuf::MethodDescriptor>
              (in_RCX,(OptionsType *)orig_options,in_stack_ffffffffffffffd0.method_descriptor,
               in_stack_ffffffffffffffcc);
  }
  else {
    in_RCX->file_ = (FileDescriptor *)0x0;
  }
  bVar1 = MethodDescriptorProto::client_streaming((MethodDescriptorProto *)0x4cd1f2);
  *(bool *)&in_RCX->file_tables_ = bVar1;
  bVar1 = MethodDescriptorProto::server_streaming((MethodDescriptorProto *)0x4cd209);
  *(bool *)((long)&in_RCX->file_tables_ + 1) = bVar1;
  MethodDescriptor::full_name_abi_cxx11_((MethodDescriptor *)in_RCX);
  MethodDescriptor::name_abi_cxx11_((MethodDescriptor *)in_RCX);
  Symbol::Symbol((Symbol *)&stack0xffffffffffffffc8,(MethodDescriptor *)in_RCX);
  AddSymbol(in_stack_00000228,in_stack_00000220,in_stack_00000218,in_stack_00000210,
            in_stack_00000208,in_stack_00000240);
  return;
}

Assistant:

void DescriptorBuilder::BuildMethod(const MethodDescriptorProto& proto,
                                    const ServiceDescriptor* parent,
                                    MethodDescriptor* result) {
  result->name_ = tables_->AllocateString(proto.name());
  result->service_ = parent;

  std::string* full_name =
      AllocateNameString(parent->full_name(), *result->name_);
  result->full_name_ = full_name;

  ValidateSymbolName(proto.name(), *full_name, proto);

  // These will be filled in when cross-linking.
  result->input_type_.Init();
  result->output_type_.Init();

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result,
                    MethodDescriptorProto::kOptionsFieldNumber);
  }

  result->client_streaming_ = proto.client_streaming();
  result->server_streaming_ = proto.server_streaming();

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}